

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

SynBinaryOpType anon_unknown.dwarf_8df1c::GetBinaryOpType(SynModifyAssignType type)

{
  SynBinaryOpType local_c;
  SynModifyAssignType type_local;
  
  switch(type) {
  case SYN_MODIFY_ASSIGN_ADD:
    local_c = SYN_BINARY_OP_ADD;
    break;
  case SYN_MODIFY_ASSIGN_SUB:
    local_c = SYN_BINARY_OP_SUB;
    break;
  case SYN_MODIFY_ASSIGN_MUL:
    local_c = SYN_BINARY_OP_MUL;
    break;
  case SYN_MODIFY_ASSIGN_DIV:
    local_c = SYN_BINARY_OP_DIV;
    break;
  case SYN_MODIFY_ASSIGN_POW:
    local_c = SYN_BINARY_OP_POW;
    break;
  case SYN_MODIFY_ASSIGN_MOD:
    local_c = SYN_BINARY_OP_MOD;
    break;
  case SYN_MODIFY_ASSIGN_SHL:
    local_c = SYN_BINARY_OP_SHL;
    break;
  case SYN_MODIFY_ASSIGN_SHR:
    local_c = SYN_BINARY_OP_SHR;
    break;
  case SYN_MODIFY_ASSIGN_BIT_AND:
    local_c = SYN_BINARY_OP_BIT_AND;
    break;
  case SYN_MODIFY_ASSIGN_BIT_OR:
    local_c = SYN_BINARY_OP_BIT_OR;
    break;
  case SYN_MODIFY_ASSIGN_BIT_XOR:
    local_c = SYN_BINARY_OP_BIT_XOR;
    break;
  default:
    local_c = SYN_BINARY_OP_UNKNOWN;
  }
  return local_c;
}

Assistant:

SynBinaryOpType GetBinaryOpType(SynModifyAssignType type)
	{
		switch(type)
		{
		case SYN_MODIFY_ASSIGN_ADD:
			return SYN_BINARY_OP_ADD;
		case SYN_MODIFY_ASSIGN_SUB:
			return SYN_BINARY_OP_SUB;
		case SYN_MODIFY_ASSIGN_MUL:
			return SYN_BINARY_OP_MUL;
		case SYN_MODIFY_ASSIGN_DIV:
			return SYN_BINARY_OP_DIV;
		case SYN_MODIFY_ASSIGN_POW:
			return SYN_BINARY_OP_POW;
		case SYN_MODIFY_ASSIGN_MOD:
			return SYN_BINARY_OP_MOD;
		case SYN_MODIFY_ASSIGN_SHL:
			return SYN_BINARY_OP_SHL;
		case SYN_MODIFY_ASSIGN_SHR:
			return SYN_BINARY_OP_SHR;
		case SYN_MODIFY_ASSIGN_BIT_AND:
			return SYN_BINARY_OP_BIT_AND;
		case SYN_MODIFY_ASSIGN_BIT_OR:
			return SYN_BINARY_OP_BIT_OR;
		case SYN_MODIFY_ASSIGN_BIT_XOR:
			return SYN_BINARY_OP_BIT_XOR;
		default:
			break;
		}

		return SYN_BINARY_OP_UNKNOWN;
	}